

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O0

void * new<NativeCodeData::AllocatorNoFixup<Js::JitPolyEquivalentTypeGuard>>
                 (size_t byteSize,AllocatorNoFixup<Js::JitPolyEquivalentTypeGuard> *alloc,
                 offset_in_AllocatorNoFixup<Js::JitPolyEquivalentTypeGuard>_to_subr AllocFunc)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  void *pvVar5;
  long in_RCX;
  long *plVar6;
  code *local_58;
  void *buffer;
  offset_in_AllocatorNoFixup<Js::JitPolyEquivalentTypeGuard>_to_subr AllocFunc_local;
  AllocatorNoFixup<Js::JitPolyEquivalentTypeGuard> *alloc_local;
  size_t byteSize_local;
  
  BVar3 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1ef,"(ExceptionCheck::CanHandleOutOfMemory())",
                       "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (byteSize == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1f0,"(byteSize != 0)","byteSize != 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  plVar6 = (long *)((long)&(alloc->super_Allocator).field_0 + in_RCX);
  local_58 = (code *)AllocFunc;
  if ((AllocFunc & 1) != 0) {
    local_58 = *(code **)(*plVar6 + (AllocFunc - 1));
  }
  pvVar5 = (void *)(*local_58)(plVar6,byteSize);
  if (pvVar5 == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1f2,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  return pvVar5;
}

Assistant:

__cdecl
operator new(DECLSPEC_GUARD_OVERFLOW size_t byteSize, TAllocator * alloc, char * (TAllocator::*AllocFunc)(size_t))
{
    AssertCanHandleOutOfMemory();
    Assert(byteSize != 0);
    void * buffer = (alloc->*AllocFunc)(byteSize);
    Assume(buffer != nullptr);
    return buffer;
}